

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void Logger::Write(LogLevel logLevel,string *str)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_mutex);
  if (iVar1 == 0) {
    poVar4 = (ostream *)&std::cerr;
    if (logLevel == Error) {
      lVar2 = 8;
      pcVar3 = "[Error] ";
    }
    else if (logLevel == Info) {
      lVar2 = 7;
      pcVar3 = "[Info] ";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[LogLevel: ",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,logLevel);
      lVar2 = 2;
      pcVar3 = "] ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)&s_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Logger::Write(LogLevel logLevel, std::string str)
{
    std::lock_guard<std::mutex> l(s_mutex);
    switch (logLevel)
    {
    case LogLevel::Info:
        std::cerr << "[Info] ";
        break;
    case LogLevel::Error:
        std::cerr << "[Error] ";
        break;
    default:
        std::cerr << "[LogLevel: " << static_cast<std::underlying_type<LogLevel>::type>(logLevel) << "] ";
        break;
    }
    std::cerr << str << std::endl;
}